

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O3

Literals * __thiscall
wasm::ShellExternalInterface::callTable
          (Literals *__return_storage_ptr__,ShellExternalInterface *this,Name tableName,
          Address index,HeapType sig,Literals *arguments,Type results,ModuleRunner *instance)

{
  char **this_00;
  _Hash_node_base *p_Var1;
  Module *pMVar2;
  IString name;
  undefined8 uVar3;
  Literals *__return_storage_ptr___00;
  bool bVar4;
  char cVar5;
  __node_base_ptr p_Var6;
  _Hash_node_base *p_Var7;
  size_t sVar8;
  Type *pTVar9;
  uintptr_t *puVar10;
  undefined8 extraout_RAX;
  ulong uVar11;
  array<wasm::Literal,_1UL> *paVar12;
  uintptr_t extraout_RDX;
  long lVar13;
  long lVar14;
  Name NVar15;
  undefined1 local_b0 [8];
  Name tableName_local;
  Literal local_98;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_80;
  Type local_68;
  Literals *local_60;
  IString *local_58;
  char **local_50;
  undefined1 local_48 [8];
  Iterator __begin2;
  
  tableName_local.super_IString.str._M_len = tableName.super_IString.str._M_str;
  local_b0 = tableName.super_IString.str._M_len;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = (size_t)this;
  p_Var6 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->tables)._M_h,
                      tableName_local.super_IString.str._M_len % (this->tables)._M_h._M_bucket_count
                      ,(key_type *)local_b0,tableName_local.super_IString.str._M_len);
  if ((p_Var6 == (__node_base_ptr)0x0) ||
     (p_Var1 = p_Var6->_M_nxt, p_Var1 == (_Hash_node_base *)0x0)) {
    callTable((ShellExternalInterface *)
              __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_80);
    wasm::Literal::~Literal(&local_98);
    _Unwind_Resume(extraout_RAX);
  }
  p_Var7 = p_Var1[3]._M_nxt;
  uVar11 = ((long)p_Var1[4]._M_nxt - (long)p_Var7 >> 3) * -0x5555555555555555;
  if (uVar11 < index.addr || uVar11 - index.addr == 0) {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x40))
              (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               "callTable overflow");
    p_Var7 = p_Var1[3]._M_nxt;
  }
  bVar4 = Type::isFunction((Type *)(p_Var7 + index.addr * 3 + 2));
  if (bVar4) {
    bVar4 = Type::isNull((Type *)(p_Var1[3]._M_nxt + index.addr * 3 + 2));
    if (!bVar4) {
      pMVar2 = (instance->super_ModuleRunnerBase<wasm::ModuleRunner>).wasm;
      NVar15 = Literal::getFunc((Literal *)(p_Var1[3]._M_nxt + index.addr * 3));
      NVar15.super_IString.str._M_str = NVar15.super_IString.str._M_len;
      NVar15.super_IString.str._M_len = (size_t)pMVar2;
      local_58 = (IString *)wasm::Module::getFunctionOrNull(NVar15);
      if (local_58 != (IString *)0x0) goto LAB_001b0348;
    }
  }
  (**(code **)(*(long *)__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .index + 0x40))
            (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
             "uninitialized table element");
  local_58 = (IString *)0x0;
LAB_001b0348:
  uVar3 = local_58 + 3;
  if (*(char **)((long)(local_58 + 3) + 8) != (char *)sig.id) {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x40))
              (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               "callIndirect: function types don\'t match");
  }
  local_60 = __return_storage_ptr__;
  local_48 = (undefined1  [8])wasm::HeapType::getSignature();
  sVar8 = Type::size((Type *)local_48);
  if (sVar8 != ((long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
               (arguments->super_SmallVector<wasm::Literal,_1UL>).usedFixed) {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x40))
              (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               "callIndirect: bad # of arguments");
  }
  local_50 = (char **)(uVar3 + 8);
  local_68.id = wasm::HeapType::getSignature();
  local_48 = (undefined1  [8])&local_68;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  pTVar9 = (Type *)Type::size((Type *)local_48);
  if (pTVar9 != (Type *)0x0) {
    lVar14 = -0x18;
    lVar13 = 0;
    do {
      puVar10 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_48);
      bVar4 = lVar13 == 0;
      lVar13 = lVar13 + -1;
      paVar12 = (array<wasm::Literal,_1UL> *)
                ((long)&((arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                         super__Vector_impl_data._M_start)->field_0 + lVar14);
      if (bVar4) {
        paVar12 = &(arguments->super_SmallVector<wasm::Literal,_1UL>).fixed;
      }
      cVar5 = wasm::Type::isSubType((Type)paVar12->_M_elems[0].type.id,(Type)*puVar10);
      if (cVar5 == '\0') {
        (**(code **)(*(long *)__begin2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index + 0x40))
                  (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   index,"callIndirect: bad argument type");
      }
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
      lVar14 = lVar14 + 0x18;
    } while ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
              pTVar9) || (local_48 != (undefined1  [8])&local_68));
  }
  wasm::HeapType::getSignature();
  if (extraout_RDX != results.id) {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x40))
              (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               "callIndirect: bad result type");
  }
  __return_storage_ptr___00 = local_60;
  if (*(long *)&local_58[2].str == 0) {
    name.str = local_58->str;
    this_00 = &tableName_local.super_IString.str._M_str;
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)this_00,
               &arguments->super_SmallVector<wasm::Literal,_1UL>);
    ModuleRunnerBase<wasm::ModuleRunner>::callFunction
              (__return_storage_ptr___00,&instance->super_ModuleRunnerBase<wasm::ModuleRunner>,
               (Name)name.str,(Literals *)this_00);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_80);
    wasm::Literal::~Literal(&local_98);
  }
  else {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x20))
              (local_60,__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .index,local_58,arguments);
  }
  return __return_storage_ptr___00;
}

Assistant:

Literals callTable(Name tableName,
                     Address index,
                     HeapType sig,
                     Literals& arguments,
                     Type results,
                     ModuleRunner& instance) override {

    auto it = tables.find(tableName);
    if (it == tables.end()) {
      trap("callTable on non-existing table");
    }

    auto& table = it->second;
    if (index >= table.size()) {
      trap("callTable overflow");
    }
    Function* func = nullptr;
    if (table[index].isFunction() && !table[index].isNull()) {
      func = instance.wasm.getFunctionOrNull(table[index].getFunc());
    }
    if (!func) {
      trap("uninitialized table element");
    }
    if (sig != func->type) {
      trap("callIndirect: function types don't match");
    }
    if (func->getParams().size() != arguments.size()) {
      trap("callIndirect: bad # of arguments");
    }
    size_t i = 0;
    for (const auto& param : func->getParams()) {
      if (!Type::isSubType(arguments[i++].type, param)) {
        trap("callIndirect: bad argument type");
      }
    }
    if (func->getResults() != results) {
      trap("callIndirect: bad result type");
    }
    if (func->imported()) {
      return callImport(func, arguments);
    } else {
      return instance.callFunction(func->name, arguments);
    }
  }